

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

void __thiscall CoreML::FeatureType::FeatureType(FeatureType *this,MLFeatureTypeType type)

{
  std::make_shared<CoreML::Specification::FeatureType>();
  switch(type) {
  case MLFeatureTypeType_int64Type:
    Specification::FeatureType::mutable_int64type
              ((this->m_type).
               super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    break;
  case MLFeatureTypeType_doubleType:
    Specification::FeatureType::mutable_doubletype
              ((this->m_type).
               super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    break;
  case MLFeatureTypeType_stringType:
    Specification::FeatureType::mutable_stringtype
              ((this->m_type).
               super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    break;
  case MLFeatureTypeType_imageType:
    Specification::FeatureType::mutable_imagetype
              ((this->m_type).
               super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    break;
  case MLFeatureTypeType_multiArrayType:
    Specification::FeatureType::mutable_multiarraytype
              ((this->m_type).
               super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    break;
  case MLFeatureTypeType_dictionaryType:
    Specification::FeatureType::mutable_dictionarytype
              ((this->m_type).
               super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    break;
  case MLFeatureTypeType_sequenceType:
    Specification::FeatureType::mutable_sequencetype
              ((this->m_type).
               super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  return;
}

Assistant:

FeatureType::FeatureType(MLFeatureTypeType type)
    : m_type(std::make_shared<Specification::FeatureType>()) {
        switch (type) {
            case MLFeatureTypeType_NOT_SET:
                break;
            case MLFeatureTypeType_multiArrayType:
                m_type->mutable_multiarraytype();
                break;
            case MLFeatureTypeType_imageType:
                m_type->mutable_imagetype();
                break;
            case MLFeatureTypeType_int64Type:
                m_type->mutable_int64type();
                break;
            case MLFeatureTypeType_doubleType:
                m_type->mutable_doubletype();
                break;
            case MLFeatureTypeType_stringType:
                m_type->mutable_stringtype();
                break;
            case MLFeatureTypeType_dictionaryType:
                m_type->mutable_dictionarytype();
                break;
            case MLFeatureTypeType_sequenceType:
                m_type->mutable_sequencetype();
                break;
        }
    }